

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
* __thiscall
kratos::GeneratorGraph::topological_sort
          (queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
           *__return_storage_ptr__,GeneratorGraph *this)

{
  iterator iVar1;
  __node_base *p_Var2;
  unordered_map<kratos::Generator_*,_kratos::GeneratorNode,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>_>
  *__range1;
  undefined1 local_70 [8];
  unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
  visited;
  GeneratorNode *node;
  
  local_70 = (undefined1  [8])&visited._M_h._M_rehash_policy._M_next_resize;
  visited._M_h._M_buckets = (__buckets_ptr)0x1;
  visited._M_h._M_bucket_count = 0;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count._0_4_ = 0x3f800000;
  visited._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited._M_h._M_rehash_policy._4_4_ = 0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  std::
  queue<kratos::GeneratorNode*,std::deque<kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>>>
  ::queue<std::deque<kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>>,void>
            (__return_storage_ptr__);
  p_Var2 = &(this->nodes_)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    visited._M_h._M_single_bucket = p_Var2 + 2;
    iVar1 = std::
            _Hashtable<kratos::GeneratorNode_*,_kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find((_Hashtable<kratos::GeneratorNode_*,_kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)local_70,(key_type *)&visited._M_h._M_single_bucket);
    if (iVar1.super__Node_iterator_base<kratos::GeneratorNode_*,_false>._M_cur == (__node_type *)0x0
       ) {
      topological_sort_helper
                (this,(GeneratorNode *)visited._M_h._M_single_bucket,
                 (unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
                  *)local_70,__return_storage_ptr__);
    }
  }
  std::
  _Hashtable<kratos::GeneratorNode_*,_kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::GeneratorNode_*,_kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::queue<GeneratorNode *> GeneratorGraph::topological_sort() {
    std::unordered_set<GeneratorNode *> visited;
    std::queue<GeneratorNode *> queue;
    for (auto &iter : nodes_) {
        auto *node = &iter.second;
        if (visited.find(node) == visited.end()) {
            // visit it
            topological_sort_helper(this, node, visited, queue);
        }
    }
    return queue;
}